

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O0

void intobuckets(group_conflict g,bucket_conflict *b,int *used1,int *used2,int pos)

{
  bucket_conflict pbVar1;
  bool bVar2;
  character cVar3;
  uint local_74;
  uint local_6c;
  int local_64;
  int local_60;
  character buckets2;
  character buckets1;
  int size;
  list_conflict tailn;
  list_conflict tail;
  uint local_40;
  boolean split;
  character prevch;
  character ch;
  group_conflict prevg;
  int pos_local;
  int *used2_local;
  int *used1_local;
  bucket_conflict *b_local;
  group_conflict g_local;
  
  for (split = 0; split < 0x100; split = split + 1) {
    used2[split] = 0;
    used1[split] = 0;
  }
  resetmem(bucketmem);
  _prevch = g;
  for (b_local = (bucket_conflict *)g->nextunf; b_local != (bucket_conflict *)0x0;
      b_local = (bucket_conflict *)b_local[3]) {
    if (*(int *)(b_local + 5) == 0) {
      pbVar1 = *b_local;
      bVar2 = false;
      if (*(string)((long)&pbVar1->head->str + (long)pos) == '\0') {
        local_6c = 0;
      }
      else {
        local_6c = (uint)*(byte *)((long)&pbVar1->head->str + (long)(pos + 1));
      }
      buckets2 = 1;
      cVar3 = buckets2;
      local_40 = (uint)*(byte *)((long)&pbVar1->head->str + (long)pos) << 8 | local_6c;
      while( true ) {
        tailn = (list_conflict)pbVar1;
        buckets2 = cVar3;
        pbVar1 = (bucket_conflict)tailn->next;
        if (pbVar1 == (bucket_conflict)0x0) break;
        if (*(string)((long)&pbVar1->head->str + (long)pos) == '\0') {
          local_74 = 0;
        }
        else {
          local_74 = (uint)*(byte *)((long)&pbVar1->head->str + (long)(pos + 1));
        }
        local_74 = (uint)*(byte *)((long)&pbVar1->head->str + (long)pos) << 8 | local_74;
        cVar3 = buckets2 + 1;
        if (local_74 != local_40) {
          intobucket(b + (int)local_40,(list_conflict)*b_local,tailn,buckets2,
                     (group_conflict)b_local);
          *b_local = pbVar1;
          bVar2 = true;
          used2[(int)(local_40 & 0xff)] = 1;
          used1[(int)local_40 >> 8] = 1;
          buckets2 = 1;
          cVar3 = buckets2;
          local_40 = local_74;
        }
      }
      if (bVar2) {
        intobucket(b + (int)local_40,(list_conflict)*b_local,tailn,buckets2,(group_conflict)b_local)
        ;
        *b_local = (bucket_conflict)0x0;
        used2[(int)(local_40 & 0xff)] = 1;
        used1[(int)local_40 >> 8] = 1;
        _prevch = (group_conflict)b_local;
      }
      else if ((local_40 & 0xff) == 0) {
        _prevch->nextunf = (group)b_local[3];
      }
      else {
        _prevch = (group_conflict)b_local;
      }
    }
    else {
      _prevch->nextunf = (group)b_local[3];
    }
  }
  local_64 = 0;
  local_60 = 0;
  for (split = 0; split < 0x100; split = split + 1) {
    if (used1[split] != 0) {
      used1[local_60] = split;
      local_60 = local_60 + 1;
    }
    if (used2[split] != 0) {
      used2[local_64] = split;
      local_64 = local_64 + 1;
    }
  }
  used1[0x100] = local_60;
  used2[0x100] = local_64;
  return;
}

Assistant:

static void intobuckets(group g, bucket b[], 
                        int *used1, int *used2, int pos)
{
   group prevg;
   character ch, prevch;
   boolean split;
   list tail, tailn;
   int size;
   character buckets1, buckets2;

   for (ch = 0; ch < CHARS; ch++)
      used1[ch] = used2[ch] = FALSE;
   resetmem(bucketmem);
   for (prevg = g, g = g->nextunf ; g; g = g->nextunf) {
      if (g->finis)
         {prevg->nextunf = g->nextunf; continue;}
      tail = g->head; split = FALSE;
      prevch = SHORT(tail->str, pos); size = 1;
      for ( ; (tailn = tail->next); tail = tailn) {
         ch = SHORT(tailn->str, pos); size++;
         if (ch == prevch) continue;
         intobucket(b+prevch, g->head, tail, size-1, g);
         g->head = tailn; split = TRUE;
         used1[HIGH(prevch)] = used2[LOW(prevch)] = TRUE;
         prevch = ch; size = 1;
      }
      if (split) {
         intobucket(b+prevch, g->head, tail, size, g);
         g->head = NULL;
         used1[HIGH(prevch)] = used2[LOW(prevch)] = TRUE;
         prevg = g;
      } else if (IS_ENDMARK(prevch))
         prevg->nextunf = g->nextunf;
      else
         prevg = g;
   }
   buckets1 = buckets2 = 0;
   for (ch = 0; ch < CHARS; ch++) {
      if (used1[ch]) used1[buckets1++] = ch;
      if (used2[ch]) used2[buckets2++] = ch;
   }
   used1[CHARS] = buckets1; used2[CHARS] = buckets2;
/* printf("#buckets: %i\n", bucketp-bucketbase); */
}